

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaMultiGenerator::CloseBuildFileStreams(cmGlobalNinjaMultiGenerator *this)

{
  bool bVar1;
  reference this_00;
  pointer this_01;
  unique_ptr *puVar2;
  mapped_type *pmVar3;
  cmAlphaNum local_180;
  cmAlphaNum local_150;
  string local_120;
  cmAlphaNum local_100;
  cmAlphaNum local_d0;
  string local_a0;
  reference local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  allocator<char> local_31;
  string local_30;
  cmGlobalNinjaMultiGenerator *local_10;
  cmGlobalNinjaMultiGenerator *this_local;
  
  local_10 = this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->CommonFileStream);
  if (bVar1) {
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::reset
              (&this->CommonFileStream,(pointer)0x0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Common file stream was not open.",&local_31);
    cmSystemTools::Error(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->DefaultFileStream);
  if (bVar1) {
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::reset
              (&this->DefaultFileStream,(pointer)0x0);
  }
  this_00 = std::
            vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
            ::operator[](&(this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.
                          super_cmGlobalGenerator.Makefiles,0);
  this_01 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->(this_00);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__begin1,this_01,IncludeEmptyConfig);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin1);
  config = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__begin1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&config), bVar1) {
    local_80 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    puVar2 = (unique_ptr *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>_>_>_>
             ::operator[](&this->ImplFileStreams,local_80);
    bVar1 = std::unique_ptr::operator_cast_to_bool(puVar2);
    if (bVar1) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>_>_>_>
               ::operator[](&this->ImplFileStreams,local_80);
      std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::reset
                (pmVar3,(pointer)0x0);
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_d0,"Impl file stream for \"");
      cmAlphaNum::cmAlphaNum(&local_100,local_80);
      cmStrCat<char[16]>(&local_a0,&local_d0,&local_100,(char (*) [16])"\" was not open.");
      cmSystemTools::Error(&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    puVar2 = (unique_ptr *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>_>_>_>
             ::operator[](&this->ConfigFileStreams,local_80);
    bVar1 = std::unique_ptr::operator_cast_to_bool(puVar2);
    if (bVar1) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>_>_>_>
               ::operator[](&this->ConfigFileStreams,local_80);
      std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::reset
                (pmVar3,(pointer)0x0);
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_150,"Config file stream for \"");
      cmAlphaNum::cmAlphaNum(&local_180,local_80);
      cmStrCat<char[16]>(&local_120,&local_150,&local_180,(char (*) [16])"\" was not open.");
      cmSystemTools::Error(&local_120);
      std::__cxx11::string::~string((string *)&local_120);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__begin1);
  return;
}

Assistant:

void cmGlobalNinjaMultiGenerator::CloseBuildFileStreams()
{
  if (this->CommonFileStream) {
    this->CommonFileStream.reset();
  } else {
    cmSystemTools::Error("Common file stream was not open.");
  }

  if (this->DefaultFileStream) {
    this->DefaultFileStream.reset();
  } // No error if it wasn't open

  for (auto const& config : this->Makefiles[0]->GetGeneratorConfigs(
         cmMakefile::IncludeEmptyConfig)) {
    if (this->ImplFileStreams[config]) {
      this->ImplFileStreams[config].reset();
    } else {
      cmSystemTools::Error(
        cmStrCat("Impl file stream for \"", config, "\" was not open."));
    }
    if (this->ConfigFileStreams[config]) {
      this->ConfigFileStreams[config].reset();
    } else {
      cmSystemTools::Error(
        cmStrCat("Config file stream for \"", config, "\" was not open."));
    }
  }
}